

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::CategoricalMapping::_InternalParse
          (CategoricalMapping *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  StringToInt64Map *msg;
  string *s;
  uint64_t value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar2;
  char cVar3;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
      if (bVar1) {
        return local_40;
      }
      local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
      tag_00 = local_34;
      uVar2 = local_34 >> 3;
      cVar3 = (char)local_34;
      if (uVar2 != 0x66) break;
      if (cVar3 != '0') goto LAB_0028cc27;
      value = google::protobuf::internal::ReadVarint64(&local_40);
      _internal_set_int64value(this,value);
LAB_0028cc19:
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if (uVar2 == 2) {
      if (cVar3 != '\x12') goto LAB_0028cc27;
      msg = (StringToInt64Map *)_internal_mutable_int64tostringmap(this);
LAB_0028cbb5:
      local_40 = google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg->super_MessageLite,local_40);
    }
    else {
      if (uVar2 == 0x65) {
        if (cVar3 == '*') {
          s = _internal_mutable_strvalue_abi_cxx11_(this);
          local_40 = google::protobuf::internal::InlineGreedyStringParser(s,local_40,ctx);
          bVar1 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
          if (!bVar1) {
            return (char *)0x0;
          }
          goto LAB_0028cc19;
        }
      }
      else if ((uVar2 == 1) && (cVar3 == '\n')) {
        msg = _internal_mutable_stringtoint64map(this);
        goto LAB_0028cbb5;
      }
LAB_0028cc27:
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      local_40 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
    }
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* CategoricalMapping::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.StringToInt64Map stringToInt64Map = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringtoint64map(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64ToStringMap int64ToStringMap = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64tostringmap(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string strValue = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          auto str = _internal_mutable_strvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int64 int64Value = 102;
      case 102:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          _internal_set_int64value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}